

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O0

uint __thiscall Kernel::Clause::maxVar(Clause *this)

{
  bool bVar1;
  uint n;
  VirtualIterator<unsigned_int> it;
  uint max;
  Clause *in_stack_00000098;
  undefined4 local_34;
  uint in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 local_c;
  
  local_c = 0;
  getVariableIterator(in_stack_00000098);
  while( true ) {
    bVar1 = Lib::VirtualIterator<unsigned_int>::hasNext((VirtualIterator<unsigned_int> *)0x84537a);
    in_stack_ffffffffffffffd4 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffd4);
    if (!bVar1) break;
    in_stack_ffffffffffffffd0 =
         Lib::VirtualIterator<unsigned_int>::next((VirtualIterator<unsigned_int> *)0x845394);
    local_34 = in_stack_ffffffffffffffd0;
    if (in_stack_ffffffffffffffd0 <= local_c) {
      local_34 = local_c;
    }
    local_c = local_34;
  }
  Lib::VirtualIterator<unsigned_int>::~VirtualIterator
            ((VirtualIterator<unsigned_int> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  return local_c;
}

Assistant:

unsigned Clause::maxVar()
{
  unsigned max = 0;
  VirtualIterator<unsigned> it = getVariableIterator();

  while (it.hasNext()) {
    unsigned n = it.next();
    max = n > max ? n : max;
  }
  return max;
}